

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

int __thiscall raspicam::_private::Private_Impl_Still::createCamera(Private_Impl_Still *this)

{
  MMAL_COMPONENT_T *pMVar1;
  MMAL_ES_FORMAT_T *pMVar2;
  MMAL_PORT_T *port;
  MMAL_STATUS_T MVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  MMAL_PARAMETER_HEADER_T local_48;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  uint local_30;
  uint local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  MVar3 = mmal_component_create("vc.ril.camera",&this->camera);
  if (MVar3 == MMAL_SUCCESS) {
    pMVar1 = this->camera;
    if (pMVar1->output_num != 0) {
      this->camera_still_port = pMVar1->output[2];
      MVar3 = mmal_port_enable(pMVar1->control,control_callback);
      if (MVar3 == MMAL_SUCCESS) {
        local_48.id = 0x10015;
        local_48.size = 0x30;
        local_40 = this->width;
        local_3c = this->height;
        local_38 = 0x100000000;
        local_28 = 3;
        uStack_20 = 0x200000000;
        local_30 = local_40;
        local_2c = local_3c;
        MVar3 = mmal_port_parameter_set(this->camera->control,&local_48);
        if (MVar3 != MMAL_SUCCESS) {
          pcVar6 = this->API_NAME;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
          }
          else {
            sVar4 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,": Could not set port parameters.\n",0x21);
        }
        commitParameters(this);
        pMVar2 = this->camera_still_port->format;
        pMVar2->encoding = 0x5651504f;
        (pMVar2->es->audio).channels = this->width;
        (pMVar2->es->audio).sample_rate = this->height;
        (pMVar2->es->audio).bits_per_sample = 0;
        (pMVar2->es->audio).block_align = 0;
        (pMVar2->es->video).crop.width = this->width;
        (pMVar2->es->video).crop.height = this->height;
        (pMVar2->es->video).frame_rate.num = 3;
        (pMVar2->es->video).frame_rate.den = 1;
        port = this->camera_still_port;
        if (port->buffer_size < port->buffer_size_min) {
          port->buffer_size = port->buffer_size_min;
        }
        port->buffer_num = port->buffer_num_recommended;
        MVar3 = mmal_port_format_commit(port);
        if (MVar3 == MMAL_SUCCESS) {
          MVar3 = mmal_component_enable(this->camera);
          if (MVar3 == MMAL_SUCCESS) {
            return 0;
          }
          pcVar6 = this->API_NAME;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
          }
          else {
            sVar4 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
          }
          pcVar6 = ": Camera component could not be enabled.\n";
          lVar5 = 0x29;
        }
        else {
          pcVar6 = this->API_NAME;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
          }
          else {
            sVar4 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
          }
          pcVar6 = ": Camera still format could not be set.\n";
          lVar5 = 0x28;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
        if (this->camera != (MMAL_COMPONENT_T *)0x0) {
          mmal_component_destroy(this->camera);
          this->camera = (MMAL_COMPONENT_T *)0x0;
        }
        return -1;
      }
      pcVar6 = this->API_NAME;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
      }
      pcVar6 = ": Could not enable control port.\n";
      lVar5 = 0x21;
      goto LAB_0010b5ff;
    }
    pcVar6 = this->API_NAME;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
    }
    pcVar6 = ": Camera does not have output ports!\n";
  }
  else {
    pcVar6 = this->API_NAME;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
    }
    pcVar6 = ": Failed to create camera component.\n";
  }
  lVar5 = 0x25;
LAB_0010b5ff:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  if (this->camera != (MMAL_COMPONENT_T *)0x0) {
    mmal_component_destroy(this->camera);
    this->camera = (MMAL_COMPONENT_T *)0x0;
  }
  return -1;
}

Assistant:

int Private_Impl_Still::createCamera() {
            if ( mmal_component_create ( MMAL_COMPONENT_DEFAULT_CAMERA, &camera ) ) {
                cout << API_NAME << ": Failed to create camera component.\n";
                destroyCamera();
                return -1;
            }

            if ( !camera->output_num ) {
                cout << API_NAME << ": Camera does not have output ports!\n";
                destroyCamera();
                return -1;
            }

            camera_still_port = camera->output[MMAL_CAMERA_CAPTURE_PORT];

            // Enable the camera, and tell it its control callback function
            if ( mmal_port_enable ( camera->control, control_callback ) ) {
                cout << API_NAME << ": Could not enable control port.\n";
                destroyCamera();
                return -1;
            }

            MMAL_PARAMETER_CAMERA_CONFIG_T camConfig = {
                {MMAL_PARAMETER_CAMERA_CONFIG, sizeof ( camConfig ) },
                width, // max_stills_w
                height, // max_stills_h
                0, // stills_yuv422
                1, // one_shot_stills
                width, // max_preview_video_w
                height, // max_preview_video_h
                3, // num_preview_video_frames
                0, // stills_capture_circular_buffer_height
                0, // fast_preview_resume
                MMAL_PARAM_TIMESTAMP_MODE_RESET_STC // use_stc_timestamp
            };
            if ( mmal_port_parameter_set ( camera->control, &camConfig.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Could not set port parameters.\n";

            commitParameters();

            MMAL_ES_FORMAT_T * format = camera_still_port->format;
            format->encoding = MMAL_ENCODING_OPAQUE;
            format->es->video.width = width;
            format->es->video.height = height;
            format->es->video.crop.x = 0;
            format->es->video.crop.y = 0;
            format->es->video.crop.width = width;
            format->es->video.crop.height = height;
            format->es->video.frame_rate.num = STILLS_FRAME_RATE_NUM;
            format->es->video.frame_rate.den = STILLS_FRAME_RATE_DEN;

            if ( camera_still_port->buffer_size < camera_still_port->buffer_size_min )
                camera_still_port->buffer_size = camera_still_port->buffer_size_min;

            camera_still_port->buffer_num = camera_still_port->buffer_num_recommended;

            if ( mmal_port_format_commit ( camera_still_port ) ) {
                cout << API_NAME << ": Camera still format could not be set.\n";
                destroyCamera();
                return -1;
            }

            if ( mmal_component_enable ( camera ) ) {
                cout << API_NAME << ": Camera component could not be enabled.\n";
                destroyCamera();
                return -1;
            }

            // This is the reason I could not free fully the camera because this pool could never be freed since 
            // the pointer encoder_pool was reassigned in createEncoder function, we lost its reference
            // so this allocation is useless or misused -> camera_pool ?
            /*if ( ! ( encoder_pool = mmal_port_pool_create ( camera_still_port, camera_still_port->buffer_num, camera_still_port->buffer_size ) ) ) {
                    cout << API_NAME << ": Failed to create buffer header pool for camera.\n";
                    destroyCamera();
                    return -1;
            }*/

            return 0;
        }